

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

int __thiscall
asl::Array<asl::Map<asl::String,_asl::String>::KeyVal>::remove
          (Array<asl::Map<asl::String,_asl::String>::KeyVal> *this,char *__filename)

{
  anon_union_16_2_78e7fdac_for_String_2 *paVar1;
  int iVar2;
  int iVar3;
  uint in_EDX;
  
  iVar2 = *(int *)&this->_a[-1].value.field_2;
  iVar3 = (int)__filename;
  if ((int)(in_EDX + iVar3) <= iVar2) {
    asl_destroy<asl::Map<asl::String,asl::String>::KeyVal>
              ((asl *)(this->_a + iVar3),(KeyVal *)(ulong)in_EDX,in_EDX);
    memmove(this->_a + iVar3,this->_a + iVar3 + (int)in_EDX,
            (long)(int)(iVar2 - (in_EDX + iVar3)) * 0x30);
    paVar1 = &this->_a[-1].value.field_2;
    *(uint *)paVar1 = *(int *)paVar1 - in_EDX;
    resize(this,iVar2 - in_EDX);
  }
  return (int)this;
}

Assistant:

Array& remove(int i, int n = 1)
	{
		int m = d().n;
		if (i + n > m)
			return *this;
		asl_destroy(_a+i, n);
		memmove((char*)(_a + i), _a + i + n, (m - i - n)*sizeof(T));
		d().n -= n;
		resize(m - n);
		return *this;
	}